

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O3

void trace_start(jit_State *J)

{
  uint8_t *puVar1;
  char cVar2;
  uint uVar3;
  TraceNo TVar4;
  GCproto *pGVar5;
  lua_State *L;
  TValue *pTVar6;
  SnapEntry *pSVar7;
  uint uVar8;
  GCRef *pGVar9;
  ptrdiff_t argbase;
  GCstr *pGVar10;
  uint lim;
  ulong uVar11;
  
  if ((J->pt->flags & 8) == 0) {
    uVar8 = J->freetrace;
    if (uVar8 == 0) {
      J->freetrace = 1;
      uVar8 = 1;
    }
    uVar3 = J->sizetrace;
    if (uVar8 < uVar3) {
      pGVar9 = J->trace;
      uVar11 = (ulong)uVar8;
      do {
        if (pGVar9[uVar11].gcptr64 == 0) {
          J->freetrace = (int)uVar11 + 1;
          goto LAB_00148367;
        }
        uVar11 = uVar11 + 1;
        J->freetrace = (TraceNo)uVar11;
      } while (uVar3 != uVar11);
    }
    uVar8 = J->param[0] + 1;
    if (0xfffe < uVar8) {
      uVar8 = 0xffff;
    }
    lim = 2;
    if (2 < uVar8) {
      lim = uVar8;
    }
    if (uVar3 < lim) {
      pGVar9 = (GCRef *)lj_mem_grow(J->L,J->trace,&J->sizetrace,lim,8);
      J->trace = pGVar9;
      if (uVar3 < J->sizetrace) {
        memset(pGVar9 + uVar3,0,(ulong)(J->sizetrace + ~uVar3) * 8 + 8);
      }
      uVar11 = (ulong)J->freetrace;
LAB_00148367:
      if ((int)uVar11 != 0) {
        pGVar9[uVar11 & 0xffffffff].gcptr64 = (uint64_t)J;
        (J->cur).mcloop = 0;
        (J->cur).nchild = 0;
        (J->cur).spadjust = 0;
        (J->cur).traceno = 0;
        (J->cur).link = 0;
        (J->cur).root = 0;
        (J->cur).nextroot = 0;
        (J->cur).ir = (IRIns *)0x0;
        (J->cur).nk = 0;
        (J->cur).nsnapmap = 0;
        (J->cur).nextgc.gcptr64 = 0;
        (J->cur).marked = '\0';
        (J->cur).gct = '\0';
        (J->cur).nsnap = 0;
        (J->cur).nins = 0;
        (J->cur).startpt.gcptr64 = 0;
        (J->cur).startpc.ptr64 = 0;
        (J->cur).startins = 0;
        (J->cur).szmcode = 0;
        (J->cur).mcode = (MCode *)0x0;
        *(undefined8 *)&(J->cur).unused_gc64 = 0;
        (J->cur).gclist.gcptr64 = 0;
        (J->cur).nextside = 0;
        (J->cur).sinktags = '\0';
        (J->cur).topslot = '\0';
        (J->cur).linktype = '\0';
        (J->cur).unused1 = '\0';
        *(undefined2 *)&(J->cur).field_0x76 = 0;
        (J->cur).traceno = (TraceNo1)uVar11;
        (J->cur).nk = 0x8000;
        (J->cur).nins = 0x8000;
        pGVar5 = J->pt;
        (J->cur).ir = J->irbuf;
        pSVar7 = J->snapmapbuf;
        (J->cur).snap = J->snapbuf;
        (J->cur).snapmap = pSVar7;
        J->postproc = LJ_POST_NONE;
        J->retryrec = '\0';
        J->ktrace = 0;
        J->mergesnap = '\0';
        J->needsnap = '\0';
        J->guardemit = '\0';
        J->bcskip = '\0';
        (J->cur).startpt.gcptr64 = (uint64_t)pGVar5;
        L = J->L;
        if ((*(byte *)((L->glref).ptr64 + 0x93) & 2) != 0) {
          argbase = lj_vmevent_prepare(L,LJ_VMEVENT_TRACE);
          if (argbase != 0) {
            pTVar6 = L->top;
            L->top = pTVar6 + 1;
            pGVar10 = lj_str_new(L,"start",5);
            pTVar6->u64 = (ulong)pGVar10 | 0xfffd800000000000;
            pTVar6 = L->top;
            L->top = pTVar6 + 1;
            pTVar6->n = (double)(int)uVar11;
            pTVar6 = L->top;
            L->top = pTVar6 + 1;
            pTVar6->u64 = (ulong)J->fn | 0xfffb800000000000;
            pTVar6 = L->top;
            L->top = pTVar6 + 1;
            pTVar6->n = (double)(int)((ulong)((long)J->pc + (-0x68 - (long)J->pt)) >> 2);
            TVar4 = J->parent;
            if (TVar4 == 0) {
              uVar8 = (byte)*J->pc - 0x41;
              if ((uVar8 < 5) && ((0x13U >> (uVar8 & 0x1f) & 1) != 0)) {
                pTVar6 = L->top;
                L->top = pTVar6 + 1;
                pTVar6->n = (double)(int)J->exitno;
                pTVar6 = L->top;
                L->top = pTVar6 + 1;
                pTVar6->u64 = 0xbff0000000000000;
              }
            }
            else {
              pTVar6 = L->top;
              L->top = pTVar6 + 1;
              pTVar6->n = (double)(int)TVar4;
              pTVar6 = L->top;
              L->top = pTVar6 + 1;
              pTVar6->n = (double)(int)J->exitno;
            }
            lj_vmevent_call(L,argbase);
          }
        }
        lj_record_setup(J);
        return;
      }
    }
    lj_trace_flushall(J->L);
  }
  else if ((J->parent == 0) && (J->exitno == 0)) {
    cVar2 = (char)*J->pc;
    if (cVar2 != 'F') {
      *(char *)J->pc = cVar2 + '\x01';
      puVar1 = &J->pt->flags;
      *puVar1 = *puVar1 | 0x10;
    }
  }
  J->state = LJ_TRACE_IDLE;
  return;
}

Assistant:

static void trace_start(jit_State *J)
{
  lua_State *L;
  TraceNo traceno;
#ifdef LUA_USE_TRACE_LOGS
  const BCIns *pc = J->pc;
#endif

  if ((J->pt->flags & PROTO_NOJIT)) {  /* JIT disabled for this proto? */
    if (J->parent == 0 && J->exitno == 0 && bc_op(*J->pc) != BC_ITERN) {
      /* Lazy bytecode patching to disable hotcount events. */
      lj_assertJ(bc_op(*J->pc) == BC_FORL || bc_op(*J->pc) == BC_ITERL ||
		 bc_op(*J->pc) == BC_LOOP || bc_op(*J->pc) == BC_FUNCF,
		 "bad hot bytecode %d", bc_op(*J->pc));
      setbc_op(J->pc, (int)bc_op(*J->pc)+(int)BC_ILOOP-(int)BC_LOOP);
      J->pt->flags |= PROTO_ILOOP;
    }
    J->state = LJ_TRACE_IDLE;  /* Silently ignored. */
    return;
  }

  /* Get a new trace number. */
  traceno = trace_findfree(J);
  if (LJ_UNLIKELY(traceno == 0)) {  /* No free trace? */
    lj_assertJ((J2G(J)->hookmask & HOOK_GC) == 0,
	       "recorder called from GC hook");
    lj_trace_flushall(J->L);
    J->state = LJ_TRACE_IDLE;  /* Silently ignored. */
    return;
  }
  setgcrefp(J->trace[traceno], &J->cur);

  /* Setup enough of the current trace to be able to send the vmevent. */
  memset(&J->cur, 0, sizeof(GCtrace));
  J->cur.traceno = traceno;
  J->cur.nins = J->cur.nk = REF_BASE;
  J->cur.ir = J->irbuf;
  J->cur.snap = J->snapbuf;
  J->cur.snapmap = J->snapmapbuf;
  J->mergesnap = 0;
  J->needsnap = 0;
  J->bcskip = 0;
  J->guardemit.irt = 0;
  J->postproc = LJ_POST_NONE;
  lj_resetsplit(J);
  J->retryrec = 0;
  J->ktrace = 0;
  setgcref(J->cur.startpt, obj2gco(J->pt));

  L = J->L;
  lj_vmevent_send(L, TRACE,
    setstrV(L, L->top++, lj_str_newlit(L, "start"));
    setintV(L->top++, traceno);
    setfuncV(L, L->top++, J->fn);
    setintV(L->top++, proto_bcpos(J->pt, J->pc));
    if (J->parent) {
      setintV(L->top++, J->parent);
      setintV(L->top++, J->exitno);
    } else {
      BCOp op = bc_op(*J->pc);
      if (op == BC_CALLM || op == BC_CALL || op == BC_ITERC) {
	setintV(L->top++, J->exitno);  /* Parent of stitched trace. */
	setintV(L->top++, -1);
      }
    }
  );
  lj_record_setup(J);
#ifdef LUA_USE_TRACE_LOGS
  lj_log_trace_start_record(L, (unsigned) J->cur.traceno, pc, J->fn);
#endif
}